

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

ssize_t nghttp2_hd_inflate_hd_nv
                  (nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out,int *inflate_flags,
                  uint8_t *in,size_t inlen,int in_final)

{
  byte bVar1;
  bool bVar2;
  nghttp2_hd_inflate_state nVar3;
  int iVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  ssize_t sVar7;
  size_t sVar8;
  byte *last;
  ulong uVar9;
  int rfin;
  nghttp2_hd_nv nv;
  int local_9c;
  uint8_t *local_98;
  nghttp2_hd_nv *local_90;
  int local_84;
  byte *local_80;
  nghttp2_mem *local_78;
  nghttp2_buf *local_70;
  nghttp2_rcbuf **local_68;
  nghttp2_rcbuf **local_60;
  nghttp2_hd_huff_decode_context *local_58;
  nghttp2_buf *local_50;
  nghttp2_hd_nv local_48;
  
  local_9c = 0;
  sVar7 = -0x20b;
  if ((inflater->ctx).bad == '\0') {
    local_78 = (inflater->ctx).mem;
    local_90 = nv_out;
    local_84 = in_final;
    nghttp2_rcbuf_decref(inflater->nv_value_keep);
    nghttp2_rcbuf_decref(inflater->nv_name_keep);
    inflater->nv_name_keep = (nghttp2_rcbuf *)0x0;
    inflater->nv_value_keep = (nghttp2_rcbuf *)0x0;
    *inflate_flags = 0;
    local_98 = in;
    local_80 = (byte *)inflate_flags;
    if (inlen != 0) {
      last = in + inlen;
      local_58 = &inflater->huff_decode_ctx;
      local_60 = &inflater->valuercbuf;
      local_70 = &inflater->valuebuf;
      local_50 = &inflater->namebuf;
      local_68 = &inflater->namercbuf;
LAB_0057d1f2:
      switch(inflater->state) {
      case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
        if ((*in & 0xe0) == 0x20) goto switchD_0057d209_caseD_1;
LAB_0057d71e:
        uVar9 = 0xfffffffffffffdf5;
        goto LAB_0057d812;
      case NGHTTP2_HD_STATE_INFLATE_START:
      case NGHTTP2_HD_STATE_OPCODE:
switchD_0057d209_caseD_1:
        bVar1 = *in;
        if ((bVar1 & 0xe0) == 0x20) {
          if (inflater->state == NGHTTP2_HD_STATE_OPCODE) goto LAB_0057d71e;
          uVar5 = 0x300000001;
LAB_0057d649:
          inflater->opcode = (int)uVar5;
          inflater->state = (int)((ulong)uVar5 >> 0x20);
        }
        else {
          if ((char)bVar1 < '\0') {
            uVar5 = 0x400000001;
            goto LAB_0057d649;
          }
          if (((bVar1 == 0) || (bVar1 == 0x40)) || (bVar1 == 0x10)) {
            inflater->opcode = NGHTTP2_HD_OPCODE_NEWNAME;
            nVar3 = NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN;
          }
          else {
            inflater->opcode = NGHTTP2_HD_OPCODE_INDNAME;
            nVar3 = NGHTTP2_HD_STATE_READ_INDEX;
          }
          inflater->state = nVar3;
          inflater->index_required = *in >> 6 & 1;
          inflater->no_index = (*in & 0xf0) == 0x10;
          in = in + (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME);
        }
        bVar2 = false;
        inflater->left = 0;
        inflater->shift = 0;
        goto LAB_0057d6d3;
      case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
        local_9c = 0;
        uVar9 = inflater->settings_hd_table_bufsize_max;
        if (inflater->min_hd_table_bufsize_max < inflater->settings_hd_table_bufsize_max) {
          uVar9 = inflater->min_hd_table_bufsize_max;
        }
        uVar9 = hd_inflate_read_len(inflater,&local_9c,in,last,5,uVar9);
        if (-1 < (long)uVar9) {
          in = in + uVar9;
          if (local_9c == 0) break;
          inflater->min_hd_table_bufsize_max = 0xffffffff;
          (inflater->ctx).hd_table_bufsize_max = inflater->left;
          bVar2 = false;
          hd_context_shrink_table_size(&inflater->ctx,(nghttp2_hd_map *)0x0);
          inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
          goto LAB_0057d6d3;
        }
        goto LAB_0057d812;
      case NGHTTP2_HD_STATE_READ_INDEX:
        sVar8 = 7;
        if (inflater->opcode != NGHTTP2_HD_OPCODE_INDEXED) {
          sVar8 = (ulong)(inflater->index_required != '\0') * 2 + 4;
        }
        local_9c = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_9c,in,last,sVar8,
                                    (inflater->ctx).hd_table.len + 0x3d);
        iVar4 = 9;
        if (-1 < (long)uVar9) {
          in = in + uVar9;
          if (local_9c == 0) {
            iVar4 = 0x16;
          }
          else if (inflater->left == 0) {
            uVar9 = 0xfffffffffffffdf5;
          }
          else {
            sVar8 = inflater->left - 1;
            if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
              inflater->index = sVar8;
              nghttp2_hd_table_get(&local_48,&inflater->ctx,sVar8);
              local_90->token = local_48.token;
              local_90->flags = local_48.flags;
              *(undefined3 *)&local_90->field_0x15 = local_48._21_3_;
              local_90->name = local_48.name;
              local_90->value = local_48.value;
              inflater->state = NGHTTP2_HD_STATE_OPCODE;
              *local_80 = *local_80 | 2;
              sVar7 = (long)in - (long)local_98;
              iVar4 = 1;
            }
            else {
              inflater->index = sVar8;
              inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
              iVar4 = 6;
            }
          }
        }
        if (iVar4 == 6) goto switchD_0057d209_default;
        if (iVar4 == 9) goto LAB_0057d812;
        if (iVar4 != 0x16) {
          return sVar7;
        }
        break;
      case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
        inflater->huffman_encoded = *in >> 7;
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
        inflater->left = 0;
        inflater->shift = 0;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
        local_9c = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_9c,in,last,7,0x10000);
        if ((long)uVar9 < 0) goto LAB_0057d812;
        in = in + uVar9;
        if (local_9c == 0) break;
        if (inflater->huffman_encoded == '\0') {
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
          sVar8 = inflater->left;
        }
        else {
          nghttp2_hd_huff_decode_context_init(local_58);
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;
          sVar8 = inflater->left * 2;
        }
        iVar4 = nghttp2_rcbuf_new(local_68,sVar8 + 1,local_78);
        if (iVar4 != 0) {
LAB_0057d80f:
          uVar9 = (ulong)iVar4;
          goto LAB_0057d812;
        }
        nghttp2_buf_wrap_init(local_50,inflater->namercbuf->base,inflater->namercbuf->len);
switchD_0057d209_default:
        bVar2 = false;
LAB_0057d6d3:
        if (in == last && !bVar2) goto LAB_0057d6e2;
        goto LAB_0057d1f2;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
        uVar9 = hd_inflate_read_huff(inflater,local_50,in,last);
        if ((long)uVar9 < 0) goto LAB_0057d812;
        in = in + uVar9;
        if (inflater->left == 0) {
LAB_0057d42b:
          *(inflater->namebuf).last = '\0';
          inflater->namercbuf->len = (long)(inflater->namebuf).last - (long)(inflater->namebuf).pos;
          inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
          goto switchD_0057d209_default;
        }
        break;
      case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
        uVar9 = (long)last - (long)in;
        if (inflater->left <= (ulong)((long)last - (long)in)) {
          uVar9 = inflater->left;
        }
        puVar6 = nghttp2_cpymem((inflater->namebuf).last,in,uVar9);
        (inflater->namebuf).last = puVar6;
        sVar8 = inflater->left;
        inflater->left = sVar8 - uVar9;
        if ((long)uVar9 < 0) goto LAB_0057d812;
        in = in + uVar9;
        if (sVar8 == uVar9) goto LAB_0057d42b;
        break;
      case NGHTTP2_HD_STATE_CHECK_VALUELEN:
        inflater->huffman_encoded = *in >> 7;
        inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
        inflater->left = 0;
        inflater->shift = 0;
      case NGHTTP2_HD_STATE_READ_VALUELEN:
        local_9c = 0;
        uVar9 = hd_inflate_read_len(inflater,&local_9c,in,last,7,0x10000);
        if (-1 < (long)uVar9) {
          in = in + uVar9;
          if (local_9c == 0) break;
          if (inflater->huffman_encoded == '\0') {
            inflater->state = NGHTTP2_HD_STATE_READ_VALUE;
            sVar8 = inflater->left;
          }
          else {
            nghttp2_hd_huff_decode_context_init(local_58);
            inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;
            sVar8 = inflater->left * 2;
          }
          iVar4 = nghttp2_rcbuf_new(local_60,sVar8 + 1,local_78);
          if (iVar4 == 0) {
            nghttp2_buf_wrap_init(local_70,inflater->valuercbuf->base,inflater->valuercbuf->len);
            bVar2 = true;
            goto LAB_0057d6d3;
          }
          goto LAB_0057d80f;
        }
        goto LAB_0057d812;
      case NGHTTP2_HD_STATE_READ_VALUEHUFF:
        uVar9 = hd_inflate_read_huff(inflater,local_70,in,last);
        if ((long)uVar9 < 0) goto LAB_0057d812;
        in = in + uVar9;
        if (inflater->left != 0) break;
LAB_0057d7c3:
        *(inflater->valuebuf).last = '\0';
        inflater->valuercbuf->len = (long)(inflater->valuebuf).last - (long)(inflater->valuebuf).pos
        ;
        if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
          iVar4 = hd_inflate_commit_newname(inflater,local_90);
        }
        else {
          iVar4 = hd_inflate_commit_indname(inflater,local_90);
        }
        if (iVar4 != 0) goto LAB_0057d80f;
        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *local_80 = *local_80 | 2;
        goto LAB_0057d768;
      case NGHTTP2_HD_STATE_READ_VALUE:
        uVar9 = (long)last - (long)in;
        if (inflater->left <= (ulong)((long)last - (long)in)) {
          uVar9 = inflater->left;
        }
        puVar6 = nghttp2_cpymem((inflater->valuebuf).last,in,uVar9);
        (inflater->valuebuf).last = puVar6;
        sVar8 = inflater->left;
        inflater->left = sVar8 - uVar9;
        if ((long)uVar9 < 0) goto LAB_0057d812;
        in = in + uVar9;
        if (sVar8 == uVar9) goto LAB_0057d7c3;
        break;
      default:
        goto switchD_0057d209_default;
      }
      uVar9 = 0xfffffffffffffdf5;
      if (local_84 == 0) goto LAB_0057d768;
      goto LAB_0057d812;
    }
LAB_0057d6e2:
    if (local_84 != 0) {
      uVar9 = 0xfffffffffffffdf5;
      if (1 < inflater->state - NGHTTP2_HD_STATE_INFLATE_START) {
LAB_0057d812:
        (inflater->ctx).bad = '\x01';
        return uVar9;
      }
      *local_80 = *local_80 | 1;
    }
LAB_0057d768:
    sVar7 = (long)in - (long)local_98;
  }
  return sVar7;
}

Assistant:

ssize_t nghttp2_hd_inflate_hd_nv(nghttp2_hd_inflater *inflater,
                                 nghttp2_hd_nv *nv_out, int *inflate_flags,
                                 const uint8_t *in, size_t inlen,
                                 int in_final) {
  ssize_t rv = 0;
  const uint8_t *first = in;
  const uint8_t *last = in + inlen;
  int rfin = 0;
  int busy = 0;
  nghttp2_mem *mem;

  mem = inflater->ctx.mem;

  if (inflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  DEBUGF("inflatehd: start state=%d\n", inflater->state);
  hd_inflate_keep_free(inflater);
  *inflate_flags = NGHTTP2_HD_INFLATE_NONE;
  for (; in != last || busy;) {
    busy = 0;
    switch (inflater->state) {
    case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
      if ((*in & 0xe0u) != 0x20u) {
        DEBUGF("inflatehd: header table size change was expected, but saw "
               "0x%02x as first byte",
               *in);
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }
    /* fall through */
    case NGHTTP2_HD_STATE_INFLATE_START:
    case NGHTTP2_HD_STATE_OPCODE:
      if ((*in & 0xe0u) == 0x20u) {
        DEBUGF("inflatehd: header table size change\n");
        if (inflater->state == NGHTTP2_HD_STATE_OPCODE) {
          DEBUGF("inflatehd: header table size change must appear at the head "
                 "of header block\n");
          rv = NGHTTP2_ERR_HEADER_COMP;
          goto fail;
        }
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_TABLE_SIZE;
      } else if (*in & 0x80u) {
        DEBUGF("inflatehd: indexed repr\n");
        inflater->opcode = NGHTTP2_HD_OPCODE_INDEXED;
        inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
      } else {
        if (*in == 0x40u || *in == 0 || *in == 0x10u) {
          DEBUGF("inflatehd: literal header repr - new name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_NEWNAME;
          inflater->state = NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN;
        } else {
          DEBUGF("inflatehd: literal header repr - indexed name\n");
          inflater->opcode = NGHTTP2_HD_OPCODE_INDNAME;
          inflater->state = NGHTTP2_HD_STATE_READ_INDEX;
        }
        inflater->index_required = (*in & 0x40) != 0;
        inflater->no_index = (*in & 0xf0u) == 0x10u;
        DEBUGF("inflatehd: indexing required=%d, no_index=%d\n",
               inflater->index_required, inflater->no_index);
        if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
          ++in;
        }
      }
      inflater->left = 0;
      inflater->shift = 0;
      break;
    case NGHTTP2_HD_STATE_READ_TABLE_SIZE:
      rfin = 0;
      rv = hd_inflate_read_len(
          inflater, &rfin, in, last, 5,
          nghttp2_min(inflater->min_hd_table_bufsize_max,
                      inflater->settings_hd_table_bufsize_max));
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        goto almost_ok;
      }
      DEBUGF("inflatehd: table_size=%zu\n", inflater->left);
      inflater->min_hd_table_bufsize_max = UINT32_MAX;
      inflater->ctx.hd_table_bufsize_max = inflater->left;
      hd_context_shrink_table_size(&inflater->ctx, NULL);
      inflater->state = NGHTTP2_HD_STATE_INFLATE_START;
      break;
    case NGHTTP2_HD_STATE_READ_INDEX: {
      size_t prefixlen;

      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        prefixlen = 7;
      } else if (inflater->index_required) {
        prefixlen = 6;
      } else {
        prefixlen = 4;
      }

      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, prefixlen,
                               get_max_index(&inflater->ctx));
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      if (inflater->left == 0) {
        rv = NGHTTP2_ERR_HEADER_COMP;
        goto fail;
      }

      DEBUGF("inflatehd: index=%zu\n", inflater->left);
      if (inflater->opcode == NGHTTP2_HD_OPCODE_INDEXED) {
        inflater->index = inflater->left;
        --inflater->index;

        hd_inflate_commit_indexed(inflater, nv_out);

        inflater->state = NGHTTP2_HD_STATE_OPCODE;
        *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;
        return (ssize_t)(in - first);
      } else {
        inflater->index = inflater->left;
        --inflater->index;

        inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;
      }
      break;
    }
    case NGHTTP2_HD_STATE_NEWNAME_CHECK_NAMELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }
      in += rv;
      if (!rfin) {
        DEBUGF("inflatehd: integer not fully decoded. current=%zu\n",
               inflater->left);

        goto almost_ok;
      }

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_NEWNAME_READ_NAME;
        rv = nghttp2_rcbuf_new(&inflater->namercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->namebuf, inflater->namercbuf->base,
                            inflater->namercbuf->len);

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAMEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_NEWNAME_READ_NAME:
      rv = hd_inflate_read(inflater, &inflater->namebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);
      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->namebuf.last = '\0';
      inflater->namercbuf->len = nghttp2_buf_len(&inflater->namebuf);

      inflater->state = NGHTTP2_HD_STATE_CHECK_VALUELEN;

      break;
    case NGHTTP2_HD_STATE_CHECK_VALUELEN:
      hd_inflate_set_huffman_encoded(inflater, in);
      inflater->state = NGHTTP2_HD_STATE_READ_VALUELEN;
      inflater->left = 0;
      inflater->shift = 0;
      DEBUGF("inflatehd: huffman encoded=%d\n", inflater->huffman_encoded != 0);
    /* Fall through */
    case NGHTTP2_HD_STATE_READ_VALUELEN:
      rfin = 0;
      rv = hd_inflate_read_len(inflater, &rfin, in, last, 7, NGHTTP2_HD_MAX_NV);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      if (!rfin) {
        goto almost_ok;
      }

      DEBUGF("inflatehd: valuelen=%zu\n", inflater->left);

      if (inflater->huffman_encoded) {
        nghttp2_hd_huff_decode_context_init(&inflater->huff_decode_ctx);

        inflater->state = NGHTTP2_HD_STATE_READ_VALUEHUFF;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left * 2 + 1,
                               mem);
      } else {
        inflater->state = NGHTTP2_HD_STATE_READ_VALUE;

        rv = nghttp2_rcbuf_new(&inflater->valuercbuf, inflater->left + 1, mem);
      }

      if (rv != 0) {
        goto fail;
      }

      nghttp2_buf_wrap_init(&inflater->valuebuf, inflater->valuercbuf->base,
                            inflater->valuercbuf->len);

      busy = 1;

      break;
    case NGHTTP2_HD_STATE_READ_VALUEHUFF:
      rv = hd_inflate_read_huff(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);

        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    case NGHTTP2_HD_STATE_READ_VALUE:
      rv = hd_inflate_read(inflater, &inflater->valuebuf, in, last);
      if (rv < 0) {
        DEBUGF("inflatehd: value read failure %zd: %s\n", rv,
               nghttp2_strerror((int)rv));
        goto fail;
      }

      in += rv;

      DEBUGF("inflatehd: %zd bytes read\n", rv);

      if (inflater->left) {
        DEBUGF("inflatehd: still %zu bytes to go\n", inflater->left);
        goto almost_ok;
      }

      *inflater->valuebuf.last = '\0';
      inflater->valuercbuf->len = nghttp2_buf_len(&inflater->valuebuf);

      if (inflater->opcode == NGHTTP2_HD_OPCODE_NEWNAME) {
        rv = hd_inflate_commit_newname(inflater, nv_out);
      } else {
        rv = hd_inflate_commit_indname(inflater, nv_out);
      }

      if (rv != 0) {
        goto fail;
      }

      inflater->state = NGHTTP2_HD_STATE_OPCODE;
      *inflate_flags |= NGHTTP2_HD_INFLATE_EMIT;

      return (ssize_t)(in - first);
    }
  }

  assert(in == last);

  DEBUGF("inflatehd: all input bytes were processed\n");

  if (in_final) {
    DEBUGF("inflatehd: in_final set\n");

    if (inflater->state != NGHTTP2_HD_STATE_OPCODE &&
        inflater->state != NGHTTP2_HD_STATE_INFLATE_START) {
      DEBUGF("inflatehd: unacceptable state=%d\n", inflater->state);
      rv = NGHTTP2_ERR_HEADER_COMP;

      goto fail;
    }
    *inflate_flags |= NGHTTP2_HD_INFLATE_FINAL;
  }
  return (ssize_t)(in - first);

almost_ok:
  if (in_final) {
    DEBUGF("inflatehd: input ended prematurely\n");

    rv = NGHTTP2_ERR_HEADER_COMP;

    goto fail;
  }
  return (ssize_t)(in - first);

fail:
  DEBUGF("inflatehd: error return %zd\n", rv);

  inflater->ctx.bad = 1;
  return rv;
}